

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O3

void __thiscall dh::scanner::debug(scanner *this)

{
  TYPE TVar1;
  uint uVar2;
  ostream *poVar3;
  pointer this_00;
  string tmp_type;
  char *local_70;
  char *local_68;
  char local_60 [16];
  string local_50;
  
  if (this->scanflag != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[INFO] Token Sries: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[INFO] Size: ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    this_00 = (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (this_00 !=
        (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_68 = (char *)0x0;
        local_60[0] = '\0';
        local_70 = local_60;
        TVar1 = token::getType(this_00);
        uVar2 = TVar1 - BOOLEAN;
        if ((uVar2 < 0x18) && ((0xfdffffU >> (uVar2 & 0x1f) & 1) != 0)) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_70,0,local_68,
                     (ulong)(&DAT_0012a0fc + *(int *)(&DAT_0012a0fc + (ulong)uVar2 * 4)));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\t",2);
        token::getVal_abi_cxx11_(&local_50,this_00);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\t",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_70,(long)local_68);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        this_00 = this_00 + 1;
      } while (this_00 !=
               (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[INFO] Token End",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[ERROR] Token Sequence is not ready\n",0x24);
  return;
}

Assistant:

void scanner::debug()
{
	if ( !scanflag)
	{
		::std::cerr << "[ERROR] Token Sequence is not ready\n";
		return;
	}

	::std::cout << "[INFO] Token Sries: " << ::std::endl;
	::std::cout << "[INFO] Size: " << _tokens.size() << ::std::endl;

	for(auto i = _tokens.begin(); i != _tokens.end(); ++i)
	{
		::std::string tmp_type;
		switch(i->getType())
		{
			case TYPE::BOOLEAN:
				tmp_type = "BOOLEAN";
				break;
			case TYPE::BREAK:
				tmp_type = "BREAK";
				break;
			case TYPE::CONTINUE:
				tmp_type = "CONTINUE";
				break;
			case TYPE::ELSE:
				tmp_type = "ELSE";
				break;
			case TYPE::FOR:
				tmp_type = "FOR";
				break;
			case TYPE::FLOAT:
				tmp_type = "FLOAT";
				break;
			case TYPE::IF:
				tmp_type = "IF";
				break;
			case TYPE::INT:
				tmp_type = "INT";
				break;
			case TYPE::RETURN:
				tmp_type = "RETURN";
				break;
			case TYPE::VOID:
				tmp_type = "VOID";
				break;
			case TYPE::WHILE:
				tmp_type = "WHILE";
				break;
			case TYPE::ADDOP:
				tmp_type = "ADDOP";
				break;
			case TYPE::MULOP:
				tmp_type = "MULOP";
				break;
			case TYPE::RELOP:
				tmp_type = "RELOP";
				break;
			case TYPE::EQUOP:
				tmp_type = "EQUOP";
				break;
			case TYPE::LOGICALOP:
				tmp_type = "LOGICALOP";
				break;
			case TYPE::ASSINGOP:
				tmp_type = "ASSINGOP";
				break;
			case TYPE::ID:
				tmp_type = "ID";
				break;
			case TYPE::SEPOP:
				tmp_type = "SEPOP";
				break;
			case TYPE::STRING:
				tmp_type = "STRING";
				break;
			case TYPE::NUMINT:
				tmp_type = "NUMINT";
				break;
			case TYPE::NUMFLOAT:
				tmp_type = "NUMFLOAT";
				break;
			case TYPE::NUMBOOLEAN:
				tmp_type = "NUMBOOLEAN";
			case TYPE::NONES:
				break;
		}
		::std::cout << "{\t" << i->getVal() << ",\t" << tmp_type << ::std::endl;
	}

	::std::cout << "[INFO] Token End" << ::std::endl;
}